

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QTime __thiscall QTime::fromString(QTime *this,QString *string,QStringView format)

{
  bool bVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  QStringView newFormat;
  QLocale local_e0;
  QCalendar local_d8;
  QDateTimeParser dt;
  QTime local_34;
  long local_30;
  
  newFormat.m_data = (storage_type_conflict *)format.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34.mds = -1;
  memset(&dt,0xaa,0x98);
  QCalendar::QCalendar(&local_d8);
  pvVar2 = (void *)0xf;
  QDateTimeParser::QDateTimeParser(&dt,QTime,FromString,local_d8);
  QLocale::c(&local_e0,pvVar2);
  QLocale::operator=(&dt.defaultLocale,&local_e0);
  QLocale::~QLocale(&local_e0);
  newFormat.m_size = (qsizetype)string;
  bVar1 = QDateTimeParser::parseFormat(&dt,newFormat);
  if (bVar1) {
    QDateTimeParser::fromString(&dt,(QString *)this,(QDate *)0x0,&local_34,0x76c);
  }
  QDateTimeParser::~QDateTimeParser(&dt);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QTime)local_34.mds;
  }
  __stack_chk_fail();
}

Assistant:

QTime QTime::fromString(const QString &string, QStringView format)
{
    QTime time;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QTime, QDateTimeParser::FromString, QCalendar());
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format))
        dt.fromString(string, nullptr, &time);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
#endif
    return time;
}